

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9GetNextExpr(SyToken *pStart,SyToken *pEnd,SyToken **ppNext)

{
  uint uVar1;
  int iVar2;
  sxi32 sVar3;
  int iVar4;
  
  sVar3 = -0x12;
  if ((pStart < pEnd) && ((pStart->nType & 0x40000) == 0)) {
    if (pStart < pEnd) {
      iVar2 = 0;
      do {
        uVar1 = pStart->nType;
        if (((uVar1 & 0x60000) != 0) && (iVar2 < 1)) break;
        iVar4 = -(uint)((uVar1 & 0x1480) != 0);
        if ((uVar1 & 0xa40) != 0) {
          iVar4 = 1;
        }
        iVar2 = iVar2 + iVar4;
        pStart = pStart + 1;
      } while (pStart < pEnd);
    }
    *ppNext = pStart;
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 jx9GetNextExpr(SyToken *pStart,SyToken *pEnd,SyToken **ppNext)
{
	SyToken *pCur = pStart;
	sxi32 iNest = 0;
	if( pCur >= pEnd || (pCur->nType & JX9_TK_SEMI/*';'*/) ){
		/* Last expression */
		return SXERR_EOF;
	}
	while( pCur < pEnd ){
		if( (pCur->nType & (JX9_TK_COMMA/*','*/|JX9_TK_SEMI/*';'*/)) && iNest <= 0){
			break;
		}
		if( pCur->nType & (JX9_TK_LPAREN/*'('*/|JX9_TK_OSB/*'['*/|JX9_TK_OCB/*'{'*/) ){
			iNest++;
		}else if( pCur->nType & (JX9_TK_RPAREN/*')'*/|JX9_TK_CSB/*']'*/|JX9_TK_CCB/*'}*/) ){
			iNest--;
		}
		pCur++;
	}
	*ppNext = pCur;
	return SXRET_OK;
}